

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

bool __thiscall
CUI::DoEditBox(CUI *this,CLineInput *pLineInput,CUIRect *pRect,float FontSize,int Corners,
              IButtonColorFunction *pColorFunction)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  CTextCursor *pCVar9;
  CUI *pCVar10;
  char *str;
  ITextRender *pIVar11;
  CLineInput *in_RDX;
  CUI *in_RSI;
  CUI *in_RDI;
  undefined8 *in_R8;
  long in_FS_OFFSET;
  bool bVar12;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  float fVar13;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar14;
  float wt;
  float w;
  bool JustGotActive;
  float TextWidth;
  int PrevOffset;
  int Offset;
  int i;
  float PreviousWidth;
  float MxRel;
  int CursorOffset;
  float VSpacing;
  float ScrollOffset;
  bool UpdateOffset;
  char *pDisplayStr;
  bool Changed;
  bool Active;
  bool Inside;
  CTextCursor *pCursor;
  CUIRect Textbox;
  CUIRect *in_stack_ffffffffffffff08;
  EInputPriority Priority;
  undefined4 in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  CUI *in_stack_ffffffffffffff18;
  CUI *in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  uint in_stack_ffffffffffffff88;
  undefined4 uVar15;
  float local_70;
  CLineInput *this_00;
  float local_18;
  float local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar9 = CLineInput::GetCursor((CLineInput *)in_RSI);
  pCVar9->m_FontSize = in_XMM0_Da;
  pCVar9->m_Align = 4;
  bVar2 = MouseHovered(in_stack_ffffffffffffff20,(CUIRect *)in_stack_ffffffffffffff18);
  pCVar10 = (CUI *)LastActiveItem(in_RDI);
  bVar12 = pCVar10 == in_RSI;
  bVar3 = CLineInput::WasChanged((CLineInput *)in_RSI);
  str = CLineInput::GetDisplayedString((CLineInput *)in_stack_ffffffffffffff18);
  bVar6 = false;
  local_70 = CLineInput::GetScrollOffset((CLineInput *)in_RSI);
  uVar15 = 0x40000000;
  CUIRect::VMargin((CUIRect *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                   in_stack_ffffffffffffff08);
  if (bVar12) {
    in_stack_ffffffffffffff88 = CLineInput::GetCursorOffset((CLineInput *)in_RSI);
    if (((!bVar2) || (bVar4 = MouseButton(in_RDI,0), !bVar4)) || (bVar3)) {
      bVar4 = MouseButton(in_RDI,0);
      if ((!bVar4) || (bVar3)) {
        DoEditBox::s_DoScroll = false;
        DoEditBox::s_SelectionStartOffset = -1;
      }
      else if ((DoEditBox::s_DoScroll & 1U) == 0) {
        if ((!bVar2) && (bVar4 = MouseButton(in_RDI,0), bVar4)) {
          DoEditBox::s_DoScroll = false;
          DoEditBox::s_SelectionStartOffset = -1;
          SetActiveItem(in_RDI,(void *)0x0);
          ClearLastActiveItem(in_RDI);
        }
      }
      else {
        fVar13 = MouseX(in_RDI);
        fVar14 = DoEditBox::s_ScrollStartX;
        if ((local_18 <= fVar13) || (fVar13 = MouseX(in_RDI), fVar14 - fVar13 <= 10.0)) {
          fVar14 = MouseX(in_RDI);
          if ((local_18 + local_10 < fVar14) &&
             (fVar14 = MouseX(in_RDI), 10.0 < fVar14 - DoEditBox::s_ScrollStartX)) {
            in_stack_ffffffffffffff88 = str_utf8_forward(str,in_stack_ffffffffffffff88);
            DoEditBox::s_ScrollStartX = MouseX(in_RDI);
            bVar6 = true;
          }
        }
        else {
          in_stack_ffffffffffffff88 =
               str_utf8_rewind((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                               ,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
          DoEditBox::s_ScrollStartX = MouseX(in_RDI);
          bVar6 = true;
        }
      }
    }
    else {
      DoEditBox::s_DoScroll = true;
      DoEditBox::s_ScrollStartX = MouseX(in_RDI);
      in_stack_ffffffffffffff84 = MouseX(in_RDI);
      in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 - local_18;
      in_stack_ffffffffffffff80 = 0.0;
      uVar8 = 0;
      for (fVar14 = 1.4013e-45; in_stack_ffffffffffffff7c = fVar14,
          iVar7 = CLineInput::GetNumChars((CLineInput *)in_RSI), in_stack_ffffffffffffff78 = uVar8,
          (int)fVar14 <= iVar7; fVar14 = (float)((int)fVar14 + 1)) {
        in_stack_ffffffffffffff78 = str_utf8_forward(str,uVar8);
        pIVar11 = TextRender(in_RDI);
        (*(pIVar11->super_IInterface)._vptr_IInterface[6])
                  (in_XMM0_Da,pIVar11,str,(ulong)in_stack_ffffffffffffff78);
        if (in_stack_ffffffffffffff84 <
            (in_stack_ffffffffffffff80 + (extraout_XMM0_Da - in_stack_ffffffffffffff80) / 2.0) -
            local_70) {
          in_stack_ffffffffffffff88 = uVar8;
          if (DoEditBox::s_SelectionStartOffset < 0) {
            DoEditBox::s_SelectionStartOffset = uVar8;
          }
          break;
        }
        fVar14 = in_stack_ffffffffffffff7c;
        in_stack_ffffffffffffff80 = extraout_XMM0_Da;
        fVar13 = (float)CLineInput::GetNumChars((CLineInput *)in_RSI);
        if ((in_stack_ffffffffffffff7c == fVar13) &&
           (in_stack_ffffffffffffff88 = CLineInput::GetLength((CLineInput *)in_RSI),
           DoEditBox::s_SelectionStartOffset < 0)) {
          DoEditBox::s_SelectionStartOffset = in_stack_ffffffffffffff88;
        }
        uVar8 = in_stack_ffffffffffffff78;
      }
    }
    if (-1 < DoEditBox::s_SelectionStartOffset) {
      CLineInput::OffsetFromDisplayToActual
                ((CLineInput *)in_stack_ffffffffffffff18,(int)in_stack_ffffffffffffff14);
      CLineInput::SetCursorOffset
                ((CLineInput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      CLineInput::OffsetFromDisplayToActual
                ((CLineInput *)in_stack_ffffffffffffff18,(int)in_stack_ffffffffffffff14);
      CLineInput::OffsetFromDisplayToActual
                ((CLineInput *)in_stack_ffffffffffffff18,(int)in_stack_ffffffffffffff14);
      CLineInput::SetSelection
                ((CLineInput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(int)in_stack_ffffffffffffff18);
    }
  }
  bVar4 = false;
  bVar5 = CheckActiveItem(in_RDI,in_RSI);
  if (bVar5) {
    bVar5 = MouseButton(in_RDI,0);
    if (!bVar5) {
      DoEditBox::s_DoScroll = false;
      DoEditBox::s_SelectionStartOffset = -1;
      SetActiveItem(in_RDI,(void *)0x0);
    }
  }
  else {
    pCVar10 = (CUI *)HotItem(in_RDI);
    if ((pCVar10 == in_RSI) && (bVar5 = MouseButton(in_RDI,0), bVar5)) {
      bVar4 = !bVar12;
      SetActiveItem(in_RDI,in_RSI);
    }
  }
  if (bVar2) {
    SetHotItem(in_RDI,in_RSI);
  }
  Priority = (EInputPriority)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  if (((bVar12) && (!bVar4)) && ((bVar6 || (bVar3)))) {
    pIVar11 = TextRender(in_RDI);
    in_stack_ffffffffffffff18 = in_RSI;
    CLineInput::GetCursorOffset((CLineInput *)in_RSI);
    uVar8 = CLineInput::OffsetFromActualToDisplay
                      ((CLineInput *)in_stack_ffffffffffffff18,(int)in_stack_ffffffffffffff14);
    (*(pIVar11->super_IInterface)._vptr_IInterface[6])(in_XMM0_Da,pIVar11,str,(ulong)uVar8);
    Priority = (EInputPriority)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    if (extraout_XMM0_Da_00 - local_70 <= local_10) {
      while (extraout_XMM0_Da_00 - local_70 < 0.0) {
        local_70 = maximum<float>(0.0,local_70 - local_10 / 3.0);
        Priority = (EInputPriority)((ulong)in_stack_ffffffffffffff08 >> 0x20);
      }
    }
    else {
      pIVar11 = TextRender(in_RDI);
      (*(pIVar11->super_IInterface)._vptr_IInterface[6])(in_XMM0_Da,pIVar11,str,0xffffffff);
      do {
        fVar14 = minimum<float>((extraout_XMM0_Da_01 - local_70) - local_10,local_10 / 3.0);
        Priority = (EInputPriority)((ulong)in_stack_ffffffffffffff08 >> 0x20);
        local_70 = fVar14 + local_70;
      } while (local_10 < extraout_XMM0_Da_00 - local_70);
    }
  }
  CLineInput::SetScrollOffset((CLineInput *)in_RSI,local_70);
  bVar6 = Enabled(in_RDI);
  if (((!bVar6) || (!bVar12)) || (bVar4)) {
    CLineInput::Deactivate((CLineInput *)0x1dd41a);
  }
  else {
    CLineInput::Activate
              ((CLineInput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),Priority)
    ;
  }
  this_00 = in_RDX;
  (**(code **)*in_R8)(in_R8,bVar12,bVar2);
  CUIRect::Draw((CUIRect *)CONCAT44(uVar15,in_stack_ffffffffffffff88),
                (vec4 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  ClipEnable(in_stack_ffffffffffffff18,
             (CUIRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  CTextCursor::MoveTo((CTextCursor *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      (float)((ulong)in_RDX >> 0x20),SUB84(in_RDX,0));
  CLineInput::Render(this_00);
  ClipDisable((CUI *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool CUI::DoEditBox(CLineInput *pLineInput, const CUIRect *pRect, float FontSize, int Corners, const IButtonColorFunction *pColorFunction)
{
	CTextCursor *pCursor = pLineInput->GetCursor();
	pCursor->m_FontSize = FontSize;
	pCursor->m_Align = TEXTALIGN_ML;

	const bool Inside = MouseHovered(pRect);
	const bool Active = LastActiveItem() == pLineInput;
	const bool Changed = pLineInput->WasChanged();
	const char *pDisplayStr = pLineInput->GetDisplayedString();

	bool UpdateOffset = false;
	float ScrollOffset = pLineInput->GetScrollOffset();

	static bool s_DoScroll = false;
	static int s_SelectionStartOffset = -1;

	const float VSpacing = 2.0f;
	CUIRect Textbox;
	pRect->VMargin(VSpacing, &Textbox);

	if(Active)
	{
		static float s_ScrollStartX = 0.0f;

		int CursorOffset = pLineInput->GetCursorOffset();

		if(Inside && MouseButton(0) && !Changed)
		{
			s_DoScroll = true;
			s_ScrollStartX = MouseX();
			const float MxRel = MouseX() - Textbox.x;
			float PreviousWidth = 0.0f;
			for(int i = 1, Offset = 0; i <= pLineInput->GetNumChars(); i++)
			{
				int PrevOffset = Offset;
				Offset = str_utf8_forward(pDisplayStr, Offset);
				const float TextWidth = TextRender()->TextWidth(FontSize, pDisplayStr, Offset);
				if(PreviousWidth + (TextWidth - PreviousWidth)/2.0f - ScrollOffset > MxRel)
				{
					CursorOffset = PrevOffset;
					if(s_SelectionStartOffset < 0)
						s_SelectionStartOffset = CursorOffset;
					break;
				}
				PreviousWidth = TextWidth;

				if(i == pLineInput->GetNumChars())
				{
					CursorOffset = pLineInput->GetLength();
					if(s_SelectionStartOffset < 0)
						s_SelectionStartOffset = CursorOffset;
				}
			}
		}
		else if(!MouseButton(0) || Changed)
		{
			s_DoScroll = false;
			s_SelectionStartOffset = -1;
		}
		else if(s_DoScroll)
		{
			// do scrolling
			if(MouseX() < Textbox.x && s_ScrollStartX-MouseX() > 10.0f)
			{
				CursorOffset = str_utf8_rewind(pDisplayStr, CursorOffset);
				s_ScrollStartX = MouseX();
				UpdateOffset = true;
			}
			else if(MouseX() > Textbox.x+Textbox.w && MouseX()-s_ScrollStartX > 10.0f)
			{
				CursorOffset = str_utf8_forward(pDisplayStr, CursorOffset);
				s_ScrollStartX = MouseX();
				UpdateOffset = true;
			}
		}
		else if(!Inside && MouseButton(0))
		{
			s_DoScroll = false;
			s_SelectionStartOffset = -1;
			SetActiveItem(0);
			ClearLastActiveItem();
		}

		if(s_SelectionStartOffset >= 0)
		{
			pLineInput->SetCursorOffset(pLineInput->OffsetFromDisplayToActual(CursorOffset));
			pLineInput->SetSelection(pLineInput->OffsetFromDisplayToActual(s_SelectionStartOffset), pLineInput->OffsetFromDisplayToActual(CursorOffset));
		}
	}

	bool JustGotActive = false;

	if(CheckActiveItem(pLineInput))
	{
		if(!MouseButton(0))
		{
			s_DoScroll = false;
			s_SelectionStartOffset = -1;
			SetActiveItem(0);
		}
	}
	else if(HotItem() == pLineInput)
	{
		if(MouseButton(0))
		{
			if(!Active)
				JustGotActive = true;
			SetActiveItem(pLineInput);
		}
	}

	if(Inside)
		SetHotItem(pLineInput);

	// check if the text has to be moved
	if(Active && !JustGotActive && (UpdateOffset || Changed))
	{
		float w = TextRender()->TextWidth(FontSize, pDisplayStr, pLineInput->OffsetFromActualToDisplay(pLineInput->GetCursorOffset()));
		if(w-ScrollOffset > Textbox.w)
		{
			// move to the left
			float wt = TextRender()->TextWidth(FontSize, pDisplayStr, -1);
			do
			{
				ScrollOffset += minimum(wt-ScrollOffset-Textbox.w, Textbox.w/3);
			}
			while(w-ScrollOffset > Textbox.w);
		}
		else if(w-ScrollOffset < 0.0f)
		{
			// move to the right
			do
			{
				ScrollOffset = maximum(0.0f, ScrollOffset-Textbox.w/3);
			}
			while(w-ScrollOffset < 0.0f);
		}
	}

	pLineInput->SetScrollOffset(ScrollOffset);
	if(Enabled() && Active && !JustGotActive)
		pLineInput->Activate(UI);
	else
		pLineInput->Deactivate();

	// render
	pRect->Draw(pColorFunction->GetColor(Active, Inside), 5.0f, Corners);
	ClipEnable(pRect);
	Textbox.x -= ScrollOffset;
	pCursor->MoveTo(Textbox.x, Textbox.y + Textbox.h/2.0f);
	pLineInput->Render();
	ClipDisable();

	return Changed;
}